

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_comp.c
# Opt level: O0

int avl_comp_int32(void *k1,void *k2)

{
  int32_t *i2;
  int32_t *i1;
  void *k2_local;
  void *k1_local;
  
  if (*k2 < *k1) {
    k1_local._4_4_ = 1;
  }
  else if (*k1 < *k2) {
    k1_local._4_4_ = -1;
  }
  else {
    k1_local._4_4_ = 0;
  }
  return k1_local._4_4_;
}

Assistant:

int
avl_comp_int32(const void *k1, const void *k2) {
  const int32_t *i1 = k1;
  const int32_t *i2 = k2;

  if (*i1 > *i2) {
    return 1;
  }
  if (*i2 > *i1) {
    return -1;
  }
  return 0;
}